

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * __thiscall
fmt::v11::detail::format_string_checker<char,_2,_0,_false>::on_format_specs
          (format_string_checker<char,_2,_0,_false> *this,int id,char *begin,char *end)

{
  parse_context<char> *in_RCX;
  parse_context<char> *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar1;
  parse_context<char> *local_8;
  
  parse_context<char>::advance_to(in_RDX,(iterator)in_RCX);
  if ((in_ESI < 0) || (1 < in_ESI)) {
    while( true ) {
      bVar1 = false;
      if (in_RDX != in_RCX) {
        bVar1 = *(char *)&(in_RDX->fmt_).data_ != '}';
      }
      local_8 = in_RDX;
      if (!bVar1) break;
      in_RDX = (parse_context<char> *)((long)&(in_RDX->fmt_).data_ + 1);
    }
  }
  else {
    local_8 = (parse_context<char> *)(**(code **)(in_RDI + 0x38 + (long)in_ESI * 8))(in_RDI + 0x18);
  }
  return (char *)local_8;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    context_.advance_to(begin);
    if (id >= 0 && id < NUM_ARGS) return parse_funcs_[id](context_);
    while (begin != end && *begin != '}') ++begin;
    return begin;
  }